

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall Highs::basisForSolution(Highs *this)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *pvVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  HighsStatus HVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  string local_b0;
  HighsBasis local_90;
  
  invalidateBasis(this);
  local_90.debug_origin_name._M_dataplus._M_p = (pointer)&local_90.debug_origin_name.field_2;
  local_90.valid = false;
  local_90.alien = true;
  local_90.useful = false;
  local_90.was_alien = true;
  local_90.debug_id = -1;
  local_90.debug_update_count = -1;
  local_90.debug_origin_name.field_2._M_allocated_capacity._0_4_ = 0x656e6f4e;
  local_90.debug_origin_name._M_string_length = 4;
  local_90.debug_origin_name.field_2._M_local_buf[4] = '\0';
  local_90.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (HighsBasisStatus *)0x0;
  local_90.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (HighsBasisStatus *)0x0;
  local_90.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (HighsBasisStatus *)0x0;
  local_90.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (HighsBasisStatus *)0x0;
  if ((this->model_).lp_.num_col_ < 1) {
    uVar7 = 0;
  }
  else {
    pvVar1 = &local_90.col_status;
    lVar8 = 0;
    uVar7 = 0;
    do {
      dVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8];
      dVar3 = (this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
      if (ABS((this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8] - dVar2) <= dVar3) {
        local_b0._M_dataplus._M_p = (pointer)((ulong)local_b0._M_dataplus._M_p._1_7_ << 8);
        if (local_90.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_90.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
          _M_realloc_insert<HighsBasisStatus>
                    (pvVar1,(iterator)
                            local_90.col_status.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_finish,(HighsBasisStatus *)&local_b0)
          ;
        }
        else {
          *local_90.col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish = kLower;
LAB_0022fa97:
          local_90.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_90.col_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else if (ABS((this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar8] - dVar2) <= dVar3) {
        local_b0._M_dataplus._M_p._0_1_ = 2;
        if (local_90.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_90.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *local_90.col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish = kUpper;
          goto LAB_0022fa97;
        }
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
        _M_realloc_insert<HighsBasisStatus>
                  (pvVar1,(iterator)
                          local_90.col_status.
                          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(HighsBasisStatus *)&local_b0);
      }
      else {
        local_b0._M_dataplus._M_p._0_1_ = 1;
        if (local_90.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_90.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
          _M_realloc_insert<HighsBasisStatus>
                    (pvVar1,(iterator)
                            local_90.col_status.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_finish,(HighsBasisStatus *)&local_b0)
          ;
        }
        else {
          *local_90.col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish = kBasic;
          local_90.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_90.col_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->model_).lp_.num_col_);
  }
  uVar4 = (this->model_).lp_.num_row_;
  uVar6 = (ulong)uVar4;
  uVar9 = (ulong)uVar7;
  if (0 < (int)uVar4) {
    pvVar1 = &local_90.row_status;
    lVar8 = 0;
    uVar9 = (ulong)uVar7;
    do {
      dVar2 = (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8];
      dVar3 = (this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
      if (ABS((this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8] - dVar2) <= dVar3) {
        local_b0._M_dataplus._M_p = (pointer)((ulong)local_b0._M_dataplus._M_p._1_7_ << 8);
        if (local_90.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_90.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
          _M_realloc_insert<HighsBasisStatus>
                    (pvVar1,(iterator)
                            local_90.row_status.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_finish,(HighsBasisStatus *)&local_b0)
          ;
        }
        else {
          *local_90.row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish = kLower;
LAB_0022fba1:
          local_90.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_90.row_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else if (ABS((this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar8] - dVar2) <= dVar3) {
        local_b0._M_dataplus._M_p._0_1_ = 2;
        if (local_90.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_90.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *local_90.row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish = kUpper;
          goto LAB_0022fba1;
        }
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
        _M_realloc_insert<HighsBasisStatus>
                  (pvVar1,(iterator)
                          local_90.row_status.
                          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(HighsBasisStatus *)&local_b0);
      }
      else {
        local_b0._M_dataplus._M_p._0_1_ = 1;
        if (local_90.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_90.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
          _M_realloc_insert<HighsBasisStatus>
                    (pvVar1,(iterator)
                            local_90.row_status.
                            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                            _M_impl.super__Vector_impl_data._M_finish,(HighsBasisStatus *)&local_b0)
          ;
        }
        else {
          *local_90.row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_finish = kBasic;
          local_90.row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_90.row_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)(this->model_).lp_.num_row_;
    } while (lVar8 < (long)uVar6);
  }
  highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
              "LP has %d rows and solution yields %d possible basic variables (%d / %d; %d / %d)\n",
              uVar6,uVar9,(ulong)uVar7,(ulong)(uint)(this->model_).lp_.num_col_,
              (ulong)((int)uVar9 - uVar7),uVar6);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  HVar5 = setBasis(this,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.row_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.col_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.debug_origin_name._M_dataplus._M_p != &local_90.debug_origin_name.field_2) {
    operator_delete(local_90.debug_origin_name._M_dataplus._M_p);
  }
  return HVar5;
}

Assistant:

HighsStatus Highs::basisForSolution() {
  HighsLp& lp = model_.lp_;
  assert(!lp.isMip() || options_.solve_relaxation);
  assert(solution_.value_valid);
  invalidateBasis();
  HighsInt num_basic = 0;
  HighsBasis basis;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (std::fabs(lp.col_lower_[iCol] - solution_.col_value[iCol]) <=
        options_.primal_feasibility_tolerance) {
      basis.col_status.push_back(HighsBasisStatus::kLower);
    } else if (std::fabs(lp.col_upper_[iCol] - solution_.col_value[iCol]) <=
               options_.primal_feasibility_tolerance) {
      basis.col_status.push_back(HighsBasisStatus::kUpper);
    } else {
      num_basic++;
      basis.col_status.push_back(HighsBasisStatus::kBasic);
    }
  }
  const HighsInt num_basic_col = num_basic;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (std::fabs(lp.row_lower_[iRow] - solution_.row_value[iRow]) <=
        options_.primal_feasibility_tolerance) {
      basis.row_status.push_back(HighsBasisStatus::kLower);
    } else if (std::fabs(lp.row_upper_[iRow] - solution_.row_value[iRow]) <=
               options_.primal_feasibility_tolerance) {
      basis.row_status.push_back(HighsBasisStatus::kUpper);
    } else {
      num_basic++;
      basis.row_status.push_back(HighsBasisStatus::kBasic);
    }
  }
  const HighsInt num_basic_row = num_basic - num_basic_col;
  assert((int)basis.col_status.size() == lp.num_col_);
  assert((int)basis.row_status.size() == lp.num_row_);
  highsLogDev(options_.log_options, HighsLogType::kInfo,
              "LP has %d rows and solution yields %d possible basic variables "
              "(%d / %d; %d / %d)\n",
              (int)lp.num_row_, (int)num_basic, (int)num_basic_col,
              (int)lp.num_col_, (int)num_basic_row, (int)lp.num_row_);
  return this->setBasis(basis);
}